

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::KeyConvertingIterator::Seek(KeyConvertingIterator *this,Slice *target)

{
  Iterator *pIVar1;
  Slice local_68;
  undefined1 local_58 [8];
  string encoded;
  ParsedInternalKey ikey;
  Slice *target_local;
  KeyConvertingIterator *this_local;
  
  ParsedInternalKey::ParsedInternalKey
            ((ParsedInternalKey *)((long)&encoded.field_2 + 8),target,&kMaxSequenceNumber,kTypeValue
            );
  std::__cxx11::string::string((string *)local_58);
  AppendInternalKey((string *)local_58,(ParsedInternalKey *)((long)&encoded.field_2 + 8));
  pIVar1 = this->iter_;
  Slice::Slice(&local_68,(string *)local_58);
  (*pIVar1->_vptr_Iterator[5])(pIVar1,&local_68);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void Seek(const Slice& target) override {
    ParsedInternalKey ikey(target, kMaxSequenceNumber, kTypeValue);
    std::string encoded;
    AppendInternalKey(&encoded, ikey);
    iter_->Seek(encoded);
  }